

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

bool __thiscall QSlider::event(QSlider *this,QEvent *event)

{
  ushort uVar1;
  QSliderPrivate *this_00;
  bool bVar2;
  QHoverEvent *he;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSliderPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x7f < 3) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QSliderPrivate::updateHoverControl(this_00,&local_28);
  }
  else if ((uVar1 == 100) || (uVar1 == 0xb1)) {
    QSliderPrivate::resetLayoutItemMargins(this_00);
  }
  bVar2 = QAbstractSlider::event(&this->super_QAbstractSlider,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSlider::event(QEvent *event)
{
    Q_D(QSlider);

    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::StyleChange:
    case QEvent::MacSizeChange:
        d->resetLayoutItemMargins();
        break;
    default:
        break;
    }
    return QAbstractSlider::event(event);
}